

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

BOOL __thiscall
Js::SmallSpanSequence::RecordARange
          (SmallSpanSequence *this,SmallSpanSequenceIter *iter,StatementData *data)

{
  code *pcVar1;
  bool bVar2;
  ushort uVar3;
  ushort uVar4;
  undefined4 *puVar5;
  GrowingUint32HeapArray *pGVar6;
  int prev;
  int iVar7;
  
  if (data == (StatementData *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x5b1,"(data)","data");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if (this->pStatementBuffer == (GrowingUint32HeapArray *)0x0) {
    pGVar6 = JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::Create(4);
    this->pStatementBuffer = pGVar6;
    iVar7 = data->sourceBegin;
    this->baseValue = iVar7;
    iter->accumulatedIndex = 0;
    iter->accumulatedSourceBegin = iVar7;
    iter->accumulatedBytecodeBegin = 0;
    iter->indexOfActualOffset = 0;
    prev = iVar7;
  }
  else {
    iVar7 = data->sourceBegin;
    prev = iter->accumulatedSourceBegin;
  }
  uVar3 = GetDiff(this,iVar7,prev);
  uVar4 = GetDiff(this,data->bytecodeBegin,iter->accumulatedBytecodeBegin);
  JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::Add
            (this->pStatementBuffer,CONCAT22(uVar3,uVar4));
  iVar7 = data->bytecodeBegin;
  iter->accumulatedSourceBegin = data->sourceBegin;
  iter->accumulatedBytecodeBegin = iVar7;
  return 1;
}

Assistant:

BOOL SmallSpanSequence::RecordARange(SmallSpanSequenceIter &iter, StatementData * data)
    {
        Assert(data);

        if (!this->pStatementBuffer)
        {
            this->pStatementBuffer = JsUtil::GrowingUint32HeapArray::Create(4);
            baseValue = data->sourceBegin;
            Reset(iter);
        }

        SmallSpan span(0);

        span.sourceBegin = GetDiff(data->sourceBegin, iter.accumulatedSourceBegin);
        span.bytecodeBegin = GetDiff(data->bytecodeBegin, iter.accumulatedBytecodeBegin);

        this->pStatementBuffer->Add((uint32)span);

        // Update iterator for the next set

        iter.accumulatedSourceBegin = data->sourceBegin;
        iter.accumulatedBytecodeBegin = data->bytecodeBegin;

        return TRUE;
    }